

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

void __thiscall nigel::Token_Operator::Token_Operator(Token_Operator *this,String *operatorToken)

{
  String *operatorToken_local;
  Token_Operator *this_local;
  
  Token::Token(&this->super_Token,operatorToken);
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Token_Operator_002b68d8;
  std::__cxx11::string::string((string *)&this->operatorToken);
  std::__cxx11::string::operator=((string *)&this->operatorToken,(string *)operatorToken);
  return;
}

Assistant:

Token_Operator( String operatorToken ) : Token( Type::operatorToken )
		{
			this->operatorToken = operatorToken;
		}